

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O3

void __thiscall
cmLinkLineComputer::ComputeLinkPath
          (cmLinkLineComputer *this,cmComputeLinkInformation *cli,string *libPathFlag,
          string *libPathTerminator,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkPath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmGeneratorTarget *pcVar3;
  size_type sVar4;
  pointer pcVar5;
  pointer pIVar6;
  bool bVar7;
  int iVar8;
  TargetType TVar9;
  ItemVector *pIVar10;
  OutputFormat OVar11;
  _Alloc_hider _Var12;
  pointer pIVar13;
  pointer pIVar14;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string linkPathNoBT;
  string local_158;
  string local_138;
  string local_118;
  size_type local_f8;
  pointer local_f0;
  size_type local_e8;
  pointer local_e0;
  undefined8 local_d8;
  char *local_d0;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_c8;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_98;
  string *local_90;
  cmLinkLineComputer *local_88;
  string *local_80;
  string local_78;
  string local_58;
  pointer local_38;
  
  pcVar2 = (cli->LinkLanguage)._M_dataplus._M_p;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_98 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)linkPath;
  local_90 = libPathTerminator;
  local_80 = libPathFlag;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar2,pcVar2 + (cli->LinkLanguage)._M_string_length);
  iVar8 = std::__cxx11::string::compare((char *)&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  local_88 = this;
  if (iVar8 == 0) {
    local_c8.Value._M_dataplus._M_p = (pointer)&local_c8.Value.field_2;
    local_c8.Value._M_string_length = 0;
    local_c8.Value.field_2._M_local_buf[0] = '\0';
    pIVar10 = cmComputeLinkInformation::GetItems(cli);
    pIVar13 = (pIVar10->
              super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pIVar14 = (pIVar10->
              super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    pIVar6 = pIVar14;
    if (pIVar13 != pIVar14) {
      do {
        local_38 = pIVar6;
        pcVar3 = pIVar13->Target;
        if ((pcVar3 != (cmGeneratorTarget *)0x0) &&
           ((TVar9 = cmGeneratorTarget::GetType(pcVar3), TVar9 == STATIC_LIBRARY ||
            (TVar9 = cmGeneratorTarget::GetType(pcVar3), TVar9 == SHARED_LIBRARY)))) {
          pcVar2 = (cli->Config)._M_dataplus._M_p;
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_118,pcVar2,pcVar2 + (cli->Config)._M_string_length);
          bVar7 = cmGeneratorTarget::HasImportLibrary(pcVar3,&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          pcVar2 = (local_80->_M_dataplus)._M_p;
          sVar4 = local_80->_M_string_length;
          pcVar3 = pIVar13->Target;
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          pcVar5 = (cli->Config)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_58,pcVar5,pcVar5 + (cli->Config)._M_string_length);
          cmGeneratorTarget::GetDirectory(&local_78,pcVar3,&local_58,(uint)bVar7);
          OVar11 = RESPONSE;
          if ((local_88->ForResponse == false) &&
             (OVar11 = WATCOMQUOTE, local_88->UseWatcomQuote == false)) {
            OVar11 = (uint)local_88->UseNinjaMulti * 2;
          }
          cmOutputConverter::ConvertToOutputForExisting
                    (&local_158,local_88->OutputConverter,&local_78,OVar11);
          local_118._M_dataplus._M_p = (pointer)0x1;
          local_118._M_string_length = 0x692614;
          local_f8 = local_158._M_string_length;
          local_f0 = local_158._M_dataplus._M_p;
          local_e0 = (local_90->_M_dataplus)._M_p;
          local_e8 = local_90->_M_string_length;
          local_d8 = 1;
          local_d0 = " ";
          views._M_len = 5;
          views._M_array = (iterator)&local_118;
          local_118.field_2._M_allocated_capacity = sVar4;
          local_118.field_2._8_8_ = pcVar2;
          cmCatViews_abi_cxx11_(&local_138,views);
          std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_138._M_dataplus._M_p);
          pIVar14 = local_38;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
        }
        pIVar13 = pIVar13 + 1;
        pIVar6 = local_38;
      } while (pIVar13 != pIVar14);
    }
    if (local_c8.Value._M_string_length != 0) {
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<std::__cxx11::string>(local_98,&local_c8.Value);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.Value._M_dataplus._M_p != &local_c8.Value.field_2) {
      operator_delete(local_c8.Value._M_dataplus._M_p,
                      CONCAT71(local_c8.Value.field_2._M_allocated_capacity._1_7_,
                               local_c8.Value.field_2._M_local_buf[0]) + 1);
    }
  }
  cmComputeLinkInformation::GetDirectoriesWithBacktraces_abi_cxx11_
            ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_78,cli);
  if (local_78._M_dataplus._M_p != (pointer)local_78._M_string_length) {
    paVar1 = &local_c8.Value.field_2;
    _Var12._M_p = local_78._M_dataplus._M_p;
    do {
      local_c8.Value._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,*(long *)_Var12._M_p,
                 *(long *)((long)_Var12._M_p + 8) + *(long *)_Var12._M_p);
      local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = *(element_type **)((long)_Var12._M_p + 0x20);
      local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)_Var12._M_p + 0x28);
      if (local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      pcVar2 = (local_80->_M_dataplus)._M_p;
      sVar4 = local_80->_M_string_length;
      OVar11 = RESPONSE;
      if ((local_88->ForResponse == false) &&
         (OVar11 = WATCOMQUOTE, local_88->UseWatcomQuote == false)) {
        OVar11 = (uint)local_88->UseNinjaMulti * 2;
      }
      cmOutputConverter::ConvertToOutputForExisting
                (&local_158,local_88->OutputConverter,&local_c8.Value,OVar11);
      local_118._M_dataplus._M_p = (pointer)0x1;
      local_118._M_string_length = 0x692614;
      local_f8 = local_158._M_string_length;
      local_f0 = local_158._M_dataplus._M_p;
      local_e0 = (local_90->_M_dataplus)._M_p;
      local_e8 = local_90->_M_string_length;
      local_d8 = 1;
      local_d0 = " ";
      views_00._M_len = 5;
      views_00._M_array = (iterator)&local_118;
      local_118.field_2._M_allocated_capacity = sVar4;
      local_118.field_2._8_8_ = pcVar2;
      cmCatViews_abi_cxx11_(&local_138,views_00);
      std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<BT<std::__cxx11::string>&>(local_98,&local_c8);
      if (local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                   TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.Value._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8.Value._M_dataplus._M_p,
                        CONCAT71(local_c8.Value.field_2._M_allocated_capacity._1_7_,
                                 local_c8.Value.field_2._M_local_buf[0]) + 1);
      }
      _Var12._M_p = _Var12._M_p + 0x30;
    } while (_Var12._M_p != (pointer)local_78._M_string_length);
  }
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_78);
  return;
}

Assistant:

void cmLinkLineComputer::ComputeLinkPath(
  cmComputeLinkInformation& cli, std::string const& libPathFlag,
  std::string const& libPathTerminator, std::vector<BT<std::string>>& linkPath)
{
  if (cli.GetLinkLanguage() == "Swift") {
    std::string linkPathNoBT;

    for (const cmComputeLinkInformation::Item& item : cli.GetItems()) {
      const cmGeneratorTarget* target = item.Target;
      if (!target) {
        continue;
      }

      if (target->GetType() == cmStateEnums::STATIC_LIBRARY ||
          target->GetType() == cmStateEnums::SHARED_LIBRARY) {
        cmStateEnums::ArtifactType type = cmStateEnums::RuntimeBinaryArtifact;
        if (target->HasImportLibrary(cli.GetConfig())) {
          type = cmStateEnums::ImportLibraryArtifact;
        }

        linkPathNoBT +=
          cmStrCat(" ", libPathFlag,
                   this->ConvertToOutputForExisting(
                     item.Target->GetDirectory(cli.GetConfig(), type)),
                   libPathTerminator, " ");
      }
    }

    if (!linkPathNoBT.empty()) {
      linkPath.emplace_back(std::move(linkPathNoBT));
    }
  }

  for (BT<std::string> libDir : cli.GetDirectoriesWithBacktraces()) {
    libDir.Value = cmStrCat(" ", libPathFlag,
                            this->ConvertToOutputForExisting(libDir.Value),
                            libPathTerminator, " ");
    linkPath.emplace_back(libDir);
  }
}